

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall
Js::DebuggerScope::GetPropertyIndex(DebuggerScope *this,PropertyId propertyId,int *index)

{
  DebuggerScopeProperty *pDVar1;
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar2;
  ulong uVar3;
  ulong uVar4;
  RegSlot RVar5;
  DebuggerScopeProperty *pDVar6;
  DebuggerScopeProperty *pDVar7;
  bool bVar8;
  
  pLVar2 = (this->scopeProperties).ptr;
  RVar5 = 0xffffffff;
  if ((pLVar2 == (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)0x0) ||
     (uVar4 = (ulong)(pLVar2->
                     super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>
                     ).count, (long)uVar4 < 1)) {
    bVar8 = false;
  }
  else {
    pDVar7 = (pLVar2->
             super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).
             buffer.ptr;
    bVar8 = true;
    if (pDVar7->propId != propertyId) {
      uVar3 = 0;
      pDVar6 = pDVar7;
      do {
        if (uVar4 - 1 == uVar3) {
          return false;
        }
        pDVar7 = pDVar6 + 1;
        uVar3 = uVar3 + 1;
        pDVar1 = pDVar6 + 1;
        pDVar6 = pDVar7;
      } while (pDVar1->propId != propertyId);
      bVar8 = uVar3 < uVar4;
    }
    RVar5 = pDVar7->location;
  }
  *index = RVar5;
  return bVar8;
}

Assistant:

bool DebuggerScope::GetPropertyIndex(Js::PropertyId propertyId, int& index)
    {
        if (!this->HasProperties())
        {
            index = -1;
            return false;
        }

        bool found = this->scopeProperties->MapUntil( [&](int i, const DebuggerScopeProperty& scopeProperty) {
            if(scopeProperty.propId == propertyId)
            {
                index = scopeProperty.location;
                return true;
            }
            return false;
        });

        if(!found)
        {
            return false;
        }
        return true;
    }